

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.c
# Opt level: O3

bool_t prf_object_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  uint8_t *buffer;
  long lVar1;
  ushort uVar2;
  uint len;
  
  if (node->opcode == prf_object_info.opcode) {
    bf_put_uint16_be(bfile,node->opcode);
    bf_put_uint16_be(bfile,node->length);
    buffer = node->data;
    bf_write(bfile,buffer,8);
    bf_put_uint32_be(bfile,*(uint32_t *)(buffer + 8));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0xc));
    bf_put_uint16_be(bfile,*(uint16_t *)(buffer + 0xe));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x10));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x12));
    bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x14));
    uVar2 = node->length;
    lVar1 = 0x1a;
    if (0x1b < uVar2) {
      bf_put_int16_be(bfile,*(int16_t *)(buffer + 0x16));
      uVar2 = node->length;
      lVar1 = 0x1c;
    }
    len = (uint)uVar2 - (uint)lVar1;
    if ((uint)lVar1 <= (uint)uVar2 && len != 0) {
      bf_write(bfile,node->data + lVar1 + -4,len);
    }
  }
  else {
    prf_error(9,"tried object save method on node of type %d.");
  }
  return 0;
}

Assistant:

static
bool_t
prf_object_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_object_info.opcode ) {
        prf_error( 9, "tried object save method on node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;
        bf_write( bfile, (uint8_t *) data->ascii_id, 8 ); pos += 8;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;
        bf_put_int16_be( bfile, data->relative_priority ); pos += 2;
        bf_put_uint16_be( bfile, data->transparency ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id1 ); pos += 2;
        bf_put_int16_be( bfile, data->special_effect_id2 ); pos += 2;
        bf_put_int16_be( bfile, data->significance ); pos += 2;
        if ( node->length < (pos + 2) ) break;
        bf_put_int16_be( bfile, data->spare ); pos += 2;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return FALSE;
}